

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

uint8_t NearLosslessComponent(uint8_t value,uint8_t predict,uint8_t boundary,int quantization)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (uint)value - (uint)predict & 0xff;
  uVar4 = (uint)boundary - (uint)predict & 0xff;
  uVar2 = -quantization & uVar3;
  uVar1 = uVar2 + quantization;
  if ((int)(uVar3 - uVar2) <
      (int)((uVar1 - uVar3) + (uint)(((uint)boundary - (uint)value & 0xff) < uVar4))) {
    uVar1 = uVar2;
    if (uVar4 < uVar2 || uVar3 <= uVar4) goto LAB_0014d4a6;
  }
  else if ((int)uVar1 <= (int)uVar4 || uVar4 < uVar3) goto LAB_0014d4a6;
  uVar1 = uVar2 + ((uint)quantization >> 1);
LAB_0014d4a6:
  return (uint8_t)uVar1;
}

Assistant:

static uint8_t NearLosslessComponent(uint8_t value, uint8_t predict,
                                     uint8_t boundary, int quantization) {
  const int residual = (value - predict) & 0xff;
  const int boundary_residual = (boundary - predict) & 0xff;
  const int lower = residual & ~(quantization - 1);
  const int upper = lower + quantization;
  // Resolve ties towards a value closer to the prediction (i.e. towards lower
  // if value comes after prediction and towards upper otherwise).
  const int bias = ((boundary - value) & 0xff) < boundary_residual;
  if (residual - lower < upper - residual + bias) {
    // lower is closer to residual than upper.
    if (residual > boundary_residual && lower <= boundary_residual) {
      // Halve quantization step to avoid crossing boundary. This midpoint is
      // on the same side of boundary as residual because midpoint >= residual
      // (since lower is closer than upper) and residual is above the boundary.
      return lower + (quantization >> 1);
    }
    return lower;
  } else {
    // upper is closer to residual than lower.
    if (residual <= boundary_residual && upper > boundary_residual) {
      // Halve quantization step to avoid crossing boundary. This midpoint is
      // on the same side of boundary as residual because midpoint <= residual
      // (since upper is closer than lower) and residual is below the boundary.
      return lower + (quantization >> 1);
    }
    return upper & 0xff;
  }
}